

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O3

_Bool SystemZ_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  DecodeStatus DVar2;
  uint8_t *orig_p;
  ulong uVar3;
  uint8_t *puVar4;
  byte bVar5;
  ulong uVar6;
  uint8_t *orig_p_2;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  uint8_t *puVar10;
  void *Decoder;
  ulong uVar11;
  ulong uVar12;
  uint64_t Value;
  long lVar13;
  uint64_t Value_1;
  ulong insn;
  bool bVar14;
  DecodeStatus local_3c;
  
  bVar5 = *code;
  bVar14 = 0xbf < bVar5;
  puVar10 = DecoderTable48;
  if (!bVar14) {
    puVar10 = "\x01\x18\b\x02@\x04";
  }
  uVar3 = 2;
  if (0x3f < bVar5) {
    uVar3 = (ulong)(bVar14 + 4 + (uint)bVar14);
  }
  puVar4 = "\x01\b\b\x02\x01T";
  if (0x3f < bVar5) {
    puVar4 = puVar10;
  }
  *size = (uint16_t)uVar3;
  if (code_len < uVar3) {
LAB_00250ff8:
    return false;
  }
  __s = MI->flat_insn->detail;
  Decoder = (void *)address;
  if (__s != (cs_detail *)0x0) {
    insn = 0;
    memset(__s,0,0x120);
    uVar3 = (ulong)*size;
    if (*size == 0) goto LAB_00250dd4;
  }
  uVar6 = 0;
  insn = 0;
  do {
    insn = insn << 8 | (ulong)code[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar3 != uVar6);
LAB_00250dd4:
  uVar3 = 0;
  local_3c = MCDisassembler_Success;
LAB_00250df3:
  do {
LAB_00250df6:
    puVar10 = puVar4;
    switch(*puVar10) {
    case '\x01':
      goto switchD_00250e0b_caseD_1;
    case '\x02':
      uVar6 = 0;
      uVar11 = 0;
      bVar5 = 0;
      do {
        lVar9 = uVar6 + 1;
        uVar11 = uVar11 + ((ulong)(puVar10[lVar9] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar6 = uVar6 + 1;
      } while ((char)puVar10[lVar9] < '\0');
      puVar4 = puVar10 + (uVar6 & 0xffffffff) + 3;
      if (uVar11 != (uVar3 & 0xffffffff)) {
        puVar4 = puVar10 + (uVar6 & 0xffffffff) + 3 +
                 *(ushort *)(puVar10 + (uVar6 & 0xffffffff) + 1);
      }
      goto LAB_00250df6;
    case '\x03':
      uVar6 = ~(-1L << (puVar10[2] & 0x3f)) << (puVar10[1] & 0x3f);
      if (puVar10[2] == 0x40) {
        uVar6 = 0xffffffffffffffff;
      }
      uVar11 = 0;
      uVar7 = 0;
      bVar5 = 0;
      do {
        lVar9 = uVar11 + 3;
        Decoder = (void *)((ulong)(puVar10[lVar9] & 0x7f) << (bVar5 & 0x3f));
        uVar7 = uVar7 + (long)Decoder;
        bVar5 = bVar5 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar10[lVar9] < '\0');
      puVar4 = puVar10 + (uVar11 & 0xffffffff) + 5;
      if ((uVar7 & 0xffffffff) != (uVar6 & insn) >> (puVar10[1] & 0x3f)) {
        puVar4 = puVar10 + (uVar11 & 0xffffffff) + 5 +
                 *(ushort *)(puVar10 + (uVar11 & 0xffffffff) + 3);
      }
      goto LAB_00250df6;
    case '\x04':
      uVar6 = 0;
      do {
        lVar9 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while ((char)puVar10[lVar9] < '\0');
      puVar4 = puVar10 + (uVar6 & 0xffffffff) + 3;
      goto LAB_00250df6;
    case '\x05':
      uVar3 = 0;
      lVar9 = 0;
      bVar5 = 0;
      do {
        lVar13 = uVar3 + 1;
        lVar9 = lVar9 + ((ulong)(puVar10[lVar13] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar3 = uVar3 + 1;
      } while ((char)puVar10[lVar13] < '\0');
      pbVar8 = puVar10 + (uVar3 & 0xffffffff) + 1;
      lVar13 = 0;
      bVar5 = 0;
      do {
        bVar1 = *pbVar8;
        lVar13 = lVar13 + ((ulong)(bVar1 & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        pbVar8 = pbVar8 + 1;
      } while ((char)bVar1 < '\0');
      MCInst_setOpcode(MI,(uint)lVar9);
      DVar2 = decodeToMCInst(local_3c,(uint)lVar13,insn,MI,address,Decoder);
      return DVar2 != MCDisassembler_Fail;
    case '\x06':
      uVar11 = 0;
      uVar6 = 0;
      bVar5 = 0;
      do {
        lVar9 = uVar11 + 1;
        uVar6 = uVar6 + ((ulong)(puVar10[lVar9] & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar10[lVar9] < '\0');
      uVar7 = 0;
      uVar12 = 0;
      bVar5 = 0;
      do {
        bVar1 = puVar10[uVar7 + (uVar11 & 0xffffffff) + 1];
        Decoder = (void *)(ulong)bVar1;
        uVar12 = uVar12 + ((ulong)(bVar1 & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
        uVar7 = uVar7 + 1;
      } while ((char)bVar1 < '\0');
      puVar4 = puVar10 + (uVar7 & 0xffffffff) + (uVar11 & 0xffffffff) + 1;
      if ((uVar12 & ~insn) != 0 || (uVar6 & insn) != 0) {
        local_3c = MCDisassembler_SoftFail;
      }
      break;
    default:
      goto LAB_00250ff8;
    }
  } while( true );
switchD_00250e0b_caseD_1:
  puVar4 = puVar10 + 3;
  uVar3 = ~(-1L << (puVar10[2] & 0x3f)) << (puVar10[1] & 0x3f);
  if (puVar10[2] == 0x40) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar3 = (uVar3 & insn) >> (puVar10[1] & 0x3f);
  goto LAB_00250df3;
}

Assistant:

bool SystemZ_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint64_t Inst;
	const uint8_t *Table;
	uint16_t I; 

	// The top 2 bits of the first byte specify the size.
	if (*code < 0x40) {
		*size = 2;
		Table = DecoderTable16;
	} else if (*code < 0xc0) {
		*size = 4;
		Table = DecoderTable32;
	} else {
		*size = 6;
		Table = DecoderTable48;
	}

	if (code_len < *size)
		// short of input data
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, sysz)+sizeof(cs_sysz));
	}

	// Construct the instruction.
	Inst = 0;
	for (I = 0; I < *size; ++I)
		Inst = (Inst << 8) | code[I];

	return decodeInstruction(Table, MI, Inst, address, info, 0);
}